

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O0

_Bool run_bitset_container_andnot
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  uint uVar1;
  _Bool _Var2;
  int iVar3;
  uint end_00;
  array_container_t *paVar4;
  bitset_container_t *pbVar5;
  undefined8 *in_RDX;
  bitset_container_t *in_RSI;
  int *in_RDI;
  uint32_t end;
  uint32_t start;
  rle16_t rle_1;
  int32_t rlepos_1;
  uint32_t last_pos;
  bitset_container_t *answer_1;
  int run_value;
  rle16_t rle;
  int32_t rlepos;
  array_container_t *answer;
  int card;
  undefined4 in_stack_ffffffffffffff98;
  int32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint32_t in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  undefined2 in_stack_ffffffffffffffae;
  int local_50;
  uint32_t local_4c;
  uint local_3c;
  int local_34;
  _Bool local_1;
  
  iVar3 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar3 < 0x1001) {
    paVar4 = array_container_create_given_capacity(in_stack_ffffffffffffff9c);
    paVar4->cardinality = 0;
    for (local_34 = 0; local_34 < *in_RDI; local_34 = local_34 + 1) {
      uVar1 = *(uint *)(*(long *)(in_RDI + 2) + (long)local_34 * 4);
      for (local_3c = uVar1 & 0xffff; (int)local_3c <= (int)((uVar1 & 0xffff) + (uVar1 >> 0x10));
          local_3c = local_3c + 1) {
        _Var2 = bitset_container_get(in_RSI,(uint16_t)local_3c);
        if (!_Var2) {
          iVar3 = paVar4->cardinality;
          paVar4->cardinality = iVar3 + 1;
          paVar4->array[iVar3] = (uint16_t)local_3c;
        }
      }
    }
    *in_RDX = paVar4;
    local_1 = false;
  }
  else {
    pbVar5 = bitset_container_clone
                       ((bitset_container_t *)
                        CONCAT26(in_stack_ffffffffffffffae,
                                 CONCAT24(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)));
    local_4c = 0;
    for (local_50 = 0; local_50 < *in_RDI; local_50 = local_50 + 1) {
      uVar1 = *(uint *)(*(long *)(in_RDI + 2) + (long)local_50 * 4);
      end_00 = uVar1 & 0xffff;
      in_stack_ffffffffffffffa4 = end_00 + (uVar1 >> 0x10) + 1;
      bitset_reset_range(pbVar5->words,local_4c,end_00);
      bitset_flip_range(pbVar5->words,end_00,in_stack_ffffffffffffffa4);
      local_4c = in_stack_ffffffffffffffa4;
    }
    bitset_reset_range(pbVar5->words,local_4c,0x10000);
    iVar3 = bitset_container_compute_cardinality
                      ((bitset_container_t *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pbVar5->cardinality = iVar3;
    if (pbVar5->cardinality < 0x1001) {
      paVar4 = array_container_from_bitset
                         ((bitset_container_t *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      *in_RDX = paVar4;
      bitset_container_free((bitset_container_t *)0x168788);
      local_1 = false;
    }
    else {
      *in_RDX = pbVar5;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool run_bitset_container_andnot(const run_container_t *src_1,
                                 const bitset_container_t *src_2,
                                 container_t **dst) {
    // follows the Java implementation as of June 2016
    int card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // must be an array
        array_container_t *answer = array_container_create_given_capacity(card);
        answer->cardinality = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            for (int run_value = rle.value; run_value <= rle.value + rle.length;
                 ++run_value) {
                if (!bitset_container_get(src_2, (uint16_t)run_value)) {
                    answer->array[answer->cardinality++] = (uint16_t)run_value;
                }
            }
        }
        *dst = answer;
        return false;
    } else {  // we guess it will be a bitset, though have to check guess when
              // done
        bitset_container_t *answer = bitset_container_clone(src_2);

        uint32_t last_pos = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];

            uint32_t start = rle.value;
            uint32_t end = start + rle.length + 1;
            bitset_reset_range(answer->words, last_pos, start);
            bitset_flip_range(answer->words, start, end);
            last_pos = end;
        }
        bitset_reset_range(answer->words, last_pos, (uint32_t)(1 << 16));

        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality <= DEFAULT_MAX_SIZE) {
            *dst = array_container_from_bitset(answer);
            bitset_container_free(answer);
            return false;  // not bitset
        }
        *dst = answer;
        return true;  // bitset
    }
}